

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR lys_compile_when(lysc_ctx *ctx,lysp_when *when_p,uint16_t inherited_flags,lysc_node *parent,
                       lysc_node *ctx_node,lysc_node *node,lysc_when **when_c)

{
  void **ppvVar1;
  lysc_ext_instance *plVar2;
  lysp_ext_instance *plVar3;
  uint16_t parent_flags;
  LY_ERR LVar4;
  lysc_when ***ppplVar5;
  long *plVar6;
  lysc_when *plVar7;
  size_t value_len;
  undefined8 *object;
  lysp_ext_instance *plVar8;
  lysp_ext_instance *plVar9;
  LY_ERR LVar10;
  lysc_when **pplVar11;
  ly_ctx *plVar12;
  undefined8 *__ptr;
  char *pcVar13;
  void *pvVar14;
  long lVar15;
  lysc_when *ptr;
  LY_VALUE_FORMAT local_34;
  
  if ((when_p == (lysp_when *)0x0) || (node == (lysc_node *)0x0 && when_c == (lysc_when **)0x0)) {
    __assert_fail("when_p && (node || when_c)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0x20a,
                  "LY_ERR lys_compile_when(struct lysc_ctx *, const struct lysp_when *, uint16_t, const struct lysc_node *, const struct lysc_node *, struct lysc_node *, struct lysc_when **)"
                 );
  }
  if (node != (lysc_node *)0x0) {
    ppplVar5 = lysc_node_when_p(node);
    pplVar11 = *ppplVar5;
    if (pplVar11 == (lysc_when **)0x0) {
      plVar6 = (long *)malloc(0x10);
      if (plVar6 != (long *)0x0) {
        *plVar6 = 1;
        goto LAB_00141add;
      }
    }
    else {
      plVar7 = pplVar11[-1];
      pplVar11[-1] = (lysc_when *)((long)&plVar7->cond + 1);
      plVar6 = (long *)realloc(pplVar11 + -1,(long)plVar7 * 8 + 0x10);
      if (plVar6 != (long *)0x0) {
LAB_00141add:
        *ppplVar5 = (lysc_when **)(plVar6 + 1);
        pplVar11 = (lysc_when **)(plVar6 + *plVar6);
        *pplVar11 = (lysc_when *)0x0;
        goto LAB_00141af8;
      }
      (*ppplVar5)[-1] = (lysc_when *)&(*ppplVar5)[-1][-1].field_0x37;
    }
LAB_00141bfa:
    plVar12 = ctx->ctx;
    pcVar13 = "lys_compile_when";
    goto LAB_00141c22;
  }
  ptr = (lysc_when *)calloc(1,0x38);
  if (ptr == (lysc_when *)0x0) goto LAB_00141bfa;
  pplVar11 = &ptr;
LAB_00141af8:
  if ((when_c == (lysc_when **)0x0) || (plVar7 = *when_c, plVar7 == (lysc_when *)0x0)) {
    plVar7 = (lysc_when *)calloc(1,0x38);
    *pplVar11 = plVar7;
    if (plVar7 == (lysc_when *)0x0) {
      plVar12 = ctx->ctx;
LAB_00141c10:
      pcVar13 = "lys_compile_when_";
LAB_00141c22:
      ly_log(plVar12,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar13);
      return LY_EMEM;
    }
    plVar7->refcount = 1;
    LVar4 = lyxp_expr_parse(ctx->ctx,when_p->cond,0,'\x01',(lyxp_expr **)plVar7);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    plVar12 = ctx->ctx;
    pcVar13 = when_p->cond;
    value_len = strlen(pcVar13);
    LVar4 = lyplg_type_prefix_data_new
                      (plVar12,pcVar13,value_len,LY_VALUE_SCHEMA,ctx->pmod,&local_34,
                       &(*pplVar11)->prefixes);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    (*pplVar11)->context = ctx_node;
    LVar4 = lydict_dup(ctx->ctx,when_p->dsc,&(*pplVar11)->dsc);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    LVar4 = lydict_dup(ctx->ctx,when_p->ref,&(*pplVar11)->ref);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    plVar8 = when_p->exts;
    if (plVar8 != (lysp_ext_instance *)0x0) {
      plVar7 = *pplVar11;
      plVar2 = plVar7->exts;
      if (plVar2 == (lysc_ext_instance *)0x0) {
        plVar6 = (long *)calloc(1,(long)plVar8[-1].exts * 0x48 + 8);
        if (plVar6 == (long *)0x0) {
          plVar12 = ctx->ctx;
          goto LAB_00141c10;
        }
        pvVar14 = (void *)0x0;
      }
      else {
        pvVar14 = plVar2[-1].compiled;
        plVar6 = (long *)realloc(&plVar2[-1].compiled,
                                 ((long)&(plVar8[-1].exts)->name + (long)pvVar14 * 2) * 0x48 + 8);
        if (plVar6 == (long *)0x0) {
          plVar12 = ctx->ctx;
          pcVar13 = "lys_compile_when_";
          goto LAB_00141c22;
        }
        plVar7 = *pplVar11;
      }
      plVar7->exts = (lysc_ext_instance *)(plVar6 + 1);
      if ((*pplVar11)->exts != (lysc_ext_instance *)0x0) {
        if (when_p->exts == (lysp_ext_instance *)0x0) {
          plVar8 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar8 = when_p->exts[-1].exts;
        }
        memset((*pplVar11)->exts + *plVar6,0,((long)&plVar8->name + (long)pvVar14) * 0x48);
      }
      lVar15 = 0;
      plVar8 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar3 = when_p->exts;
        if (plVar3 == (lysp_ext_instance *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = plVar3[-1].exts;
        }
        if (plVar9 <= plVar8) break;
        plVar7 = *pplVar11;
        plVar2 = plVar7->exts;
        pvVar14 = plVar2[-1].compiled;
        plVar2[-1].compiled = (void *)((long)pvVar14 + 1);
        LVar4 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar3->name + lVar15),
                                plVar2 + (long)pvVar14,plVar7);
        if (LVar4 != LY_SUCCESS) {
          if (LVar4 != LY_ENOT) {
            return LVar4;
          }
          ppvVar1 = &(*pplVar11)->exts[-1].compiled;
          *ppvVar1 = (void *)((long)*ppvVar1 + -1);
        }
        plVar8 = (lysp_ext_instance *)((long)&plVar8->name + 1);
        lVar15 = lVar15 + 0x70;
      }
    }
    if (parent == (lysc_node *)0x0) {
      parent_flags = 0;
      pcVar13 = (char *)0x0;
    }
    else {
      parent_flags = parent->flags;
      pcVar13 = parent->name;
    }
    LVar4 = lys_compile_status(ctx,0,inherited_flags,parent_flags,pcVar13,"when",&(*pplVar11)->flags
                              );
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    if (when_c != (lysc_when **)0x0) {
      *when_c = *pplVar11;
    }
  }
  else {
    plVar7->refcount = plVar7->refcount + 1;
    *pplVar11 = plVar7;
  }
  if (node == (lysc_node *)0x0) {
    return LY_SUCCESS;
  }
  if ((ctx->compile_opts & 3) == 0) {
    plVar7 = *pplVar11;
    object = (undefined8 *)calloc(1,0x10);
    if (object != (undefined8 *)0x0) {
      *object = node;
      object[1] = plVar7;
      LVar10 = LY_SUCCESS;
      LVar4 = ly_set_add(&ctx->unres->whens,object,'\x01',(uint32_t *)0x0);
      __ptr = (undefined8 *)0x0;
      if (LVar4 == LY_SUCCESS) goto LAB_00141c9b;
    }
    LVar10 = LY_EMEM;
    ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysc_unres_when_add");
    __ptr = object;
  }
  else {
    LVar10 = LY_SUCCESS;
    __ptr = (undefined8 *)0x0;
  }
LAB_00141c9b:
  free(__ptr);
  return LVar10;
}

Assistant:

LY_ERR
lys_compile_when(struct lysc_ctx *ctx, const struct lysp_when *when_p, uint16_t inherited_flags, const struct lysc_node *parent,
        const struct lysc_node *ctx_node, struct lysc_node *node, struct lysc_when **when_c)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysc_when **new_when, ***node_when, *ptr;

    assert(when_p && (node || when_c));

    if (node) {
        /* get the when array */
        node_when = lysc_node_when_p(node);

        /* create new when pointer */
        LY_ARRAY_NEW_GOTO(ctx->ctx, *node_when, new_when, rc, cleanup);
    } else {
        /* individual when */
        new_when = &ptr;
        *new_when = calloc(1, sizeof **new_when);
        LY_CHECK_ERR_GOTO(!*new_when, LOGMEM(ctx->ctx); rc = LY_EMEM, cleanup);
    }

    if (!when_c || !(*when_c)) {
        /* compile when */
        LY_CHECK_GOTO(rc = lys_compile_when_(ctx, when_p, inherited_flags, parent, ctx_node, new_when), cleanup);

        /* remember the compiled when for sharing */
        if (when_c) {
            *when_c = *new_when;
        }
    } else {
        /* use the previously compiled when */
        ++(*when_c)->refcount;
        *new_when = *when_c;
    }

    if (node) {
        /* add when to unres if there is a node for evaluation (not for extension instances) */
        LY_CHECK_GOTO(rc = lysc_unres_when_add(ctx, *new_when, node), cleanup);
    }

cleanup:
    return rc;
}